

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::MoveElementTo
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
           *this,PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *element,
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
          *list)

{
  undefined4 *puVar1;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar2;
  code *pcVar3;
  bool bVar4;
  DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar5;
  DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar6;
  undefined8 *in_FS_OFFSET;
  
  pDVar6 = (DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)
           (element[-1].decommitPages.data + 4);
  pDVar5 = (DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)this;
  do {
    pDVar5 = (pDVar5->
             super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
             next.node;
    if (pDVar5 == (DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)
                  this) break;
  } while (pDVar5 != pDVar6);
  if (pDVar5 == (DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)this)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x1a9,"(HasNode(node))","HasNode(node)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  **(anon_union_8_3_7fb8a913_for_next **)&element[-1].freePageCount =
       (pDVar6->
       super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next;
  ((pDVar6->super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
   next.base)->prev = *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].freePageCount;
  pDVar2 = (list->
           super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
           next.base;
  *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].freePageCount = pDVar2->prev;
  (pDVar6->super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
  next.base = pDVar2;
  *(DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> **)pDVar2->prev =
       pDVar6;
  (pDVar2->prev).node = pDVar6;
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  (list->super_RealCount).count = (list->super_RealCount).count + 1;
  return;
}

Assistant:

void MoveElementTo(TData * element, DListBase * list)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        DListBase::InsertNodeBefore(list->Next(), node);
        this->DecrementCount();
        list->IncrementCount();
    }